

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall TPZFront<double>::Print(TPZFront<double> *this,char *name,ostream *out)

{
  ostream *poVar1;
  ostream *in_RDX;
  char *in_RSI;
  
  if (in_RSI != (char *)0x0) {
    poVar1 = std::operator<<(in_RDX,in_RSI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(in_RDX,"Not implemented in the abstract Class !");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Try one of the subclasses");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZFront<TVar>::Print(const char *name, std::ostream& out) const
{
	if(name) out << name << endl;
	/*int i,j,loop_limit;
	 
	 
	 out <<  "Frontal Matrix Size          "<< fFront << endl;
	 out <<  "Maximum Frontal Matrix Size  "<< fMaxFront << endl;
	 
	 out << endl;
	 out <<  "Local Indexation "<< endl;
	 out <<  "Position  "<<" Local index"<< endl;
	 for(i=0;i<fLocal.NElements();i++){
	 out <<   i <<  "         "  << fLocal[i] << endl;
	 }
	 
	 out << endl;
	 out <<  "Global Indexation "<< endl;
	 out <<  "Position  "<<" Global index"<< endl;
	 
	 for(i=0;i<fGlobal.NElements();i++){
	 out <<   i <<  "            "<< fGlobal[i] << endl;
	 }
	 
	 out << endl;
	 out <<  "Local Freed Equatoins  "<< fFree.NElements() << endl;
	 out <<  "position "<<   "Local Equation "<<endl;
	 loop_limit=fFree.NElements();
	 for(i=0;i<loop_limit;i++){
	 out <<  i <<  "             " << fFree[i] << endl;
	 }
	 out <<  "Frontal Matrix "<< endl;
	 if(fData.NElements() > 0) {
	 for(i=0;i<fFront;i++){
	 for(j=0;j<fFront;j++) out << ((i<j) ? Element(i,j) : Element(j,i)) <<  " ";
	 out << endl;
	 }
	 }*/
	
	out << "Not implemented in the abstract Class !" << endl;
	out << "Try one of the subclasses" << endl;
}